

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

ostream * operator<<(ostream *os,NodeUID *uid)

{
  ostream *poVar1;
  int *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"{");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
  poVar1 = std::operator<<(poVar1,"}");
  return poVar1;
}

Assistant:

static std::ostream& operator<<(std::ostream& os, const cpprofiler::NodeUID& uid) {
	return os << "{" << uid.nid << ", " << uid.rid << ", " << uid.tid << "}";
}